

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qasm.hpp
# Opt level: O1

__string_type * __thiscall
qclab::qasm1_abi_cxx11_(__string_type *__return_storage_ptr__,qclab *this,char *type,int qubit)

{
  size_t sVar1;
  ostream *poVar2;
  stringstream stream;
  stringstream asStack_1a8 [16];
  long local_198 [14];
  ios_base local_128 [264];
  
  std::__cxx11::stringstream::stringstream(asStack_1a8);
  if (this == (qclab *)0x0) {
    std::ios::clear((int)(ostream *)local_198 + (int)*(undefined8 *)(local_198[0] + -0x18));
  }
  else {
    sVar1 = strlen((char *)this);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,(char *)this,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198," q[",3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_198,(int)type);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];\n",3);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1a8);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

inline auto qasm1( const char type[] , const int qubit ) {
    std::stringstream stream ;
    stream << type << " q[" << qubit << "];\n" ;
    return stream.str() ;
  }